

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O0

char * cmCTestResourceSpec::ResultToString(ReadFileResult result)

{
  char *pcStack_10;
  ReadFileResult result_local;
  
  switch(result) {
  case READ_OK:
    pcStack_10 = "OK";
    break;
  case FILE_NOT_FOUND:
    pcStack_10 = "File not found";
    break;
  case JSON_PARSE_ERROR:
    pcStack_10 = "JSON parse error";
    break;
  case INVALID_ROOT:
    pcStack_10 = "Invalid root object";
    break;
  case NO_VERSION:
    pcStack_10 = "No version specified";
    break;
  case INVALID_VERSION:
    pcStack_10 = "Invalid version object";
    break;
  case UNSUPPORTED_VERSION:
    pcStack_10 = "Unsupported version";
    break;
  case INVALID_SOCKET_SPEC:
    pcStack_10 = "Invalid socket object";
    break;
  case INVALID_RESOURCE_TYPE:
    pcStack_10 = "Invalid resource type object";
    break;
  case INVALID_RESOURCE:
    pcStack_10 = "Invalid resource object";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const char* cmCTestResourceSpec::ResultToString(ReadFileResult result)
{
  switch (result) {
    case ReadFileResult::READ_OK:
      return "OK";

    case ReadFileResult::FILE_NOT_FOUND:
      return "File not found";

    case ReadFileResult::JSON_PARSE_ERROR:
      return "JSON parse error";

    case ReadFileResult::INVALID_ROOT:
      return "Invalid root object";

    case ReadFileResult::NO_VERSION:
      return "No version specified";

    case ReadFileResult::INVALID_VERSION:
      return "Invalid version object";

    case ReadFileResult::UNSUPPORTED_VERSION:
      return "Unsupported version";

    case ReadFileResult::INVALID_SOCKET_SPEC:
      return "Invalid socket object";

    case ReadFileResult::INVALID_RESOURCE_TYPE:
      return "Invalid resource type object";

    case ReadFileResult::INVALID_RESOURCE:
      return "Invalid resource object";

    default:
      return "Unknown";
  }
}